

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O0

bool __thiscall Omega_h::any::is_typed(any *this,type_info *t)

{
  bool bVar1;
  type_info *a;
  type_info *t_local;
  any *this_local;
  
  a = type(this);
  bVar1 = is_same(a,t);
  return bVar1;
}

Assistant:

bool is_typed(const std::type_info& t) const {
    return is_same(this->type(), t);
  }